

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

Gia_Obj_t * Gia_ObjRiToRo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsRi(p,pObj);
  if (iVar1 != 0) {
    iVar1 = Gia_ManCiNum(p);
    iVar2 = Gia_ManCoNum(p);
    iVar3 = Gia_ObjCioId(pObj);
    pGVar4 = Gia_ManCi(p,(iVar1 - iVar2) + iVar3);
    return pGVar4;
  }
  __assert_fail("Gia_ObjIsRi(p, pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1dc,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline Gia_Obj_t *  Gia_ObjRiToRo( Gia_Man_t * p, Gia_Obj_t * pObj )    { assert( Gia_ObjIsRi(p, pObj) ); return Gia_ManCi(p, Gia_ManCiNum(p) - Gia_ManCoNum(p) + Gia_ObjCioId(pObj)); }